

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::FboTestUtil::TextureCubeArrayShader::TextureCubeArrayShader
          (TextureCubeArrayShader *this,DataType samplerType,DataType outputType,
          GLSLVersion glslVersion)

{
  GenericVecType type_;
  deBool dVar1;
  ShaderProgramDeclaration *pSVar2;
  InternalError *this_00;
  char *pcVar3;
  allocator<char> local_541;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  FragmentSource local_420;
  allocator<char> local_3f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  VertexSource local_398;
  allocator<char> local_371;
  string local_370;
  Uniform local_350;
  allocator<char> local_321;
  string local_320;
  Uniform local_300;
  allocator<char> local_2d1;
  string local_2d0;
  Uniform local_2b0;
  allocator<char> local_281;
  string local_280;
  Uniform local_260;
  allocator<char> local_231;
  string local_230;
  Uniform local_210;
  FragmentOutput local_1e8;
  VertexToFragmentVarying local_1e4;
  allocator<char> local_1d9;
  string local_1d8;
  VertexAttribute local_1b8;
  allocator<char> local_179;
  string local_178;
  VertexAttribute local_158;
  ShaderProgramDeclaration local_130;
  GLSLVersion local_1c;
  DataType local_18;
  GLSLVersion glslVersion_local;
  DataType outputType_local;
  DataType samplerType_local;
  TextureCubeArrayShader *this_local;
  
  local_1c = glslVersion;
  local_18 = outputType;
  glslVersion_local = samplerType;
  _outputType_local = this;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"a_position",&local_179);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_158,&local_178,GENERICVECTYPE_FLOAT);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_130,&local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"a_coord",&local_1d9);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_1b8,&local_1d8,GENERICVECTYPE_FLOAT);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_1b8);
  sglr::pdec::VertexToFragmentVarying::VertexToFragmentVarying(&local_1e4,GENERICVECTYPE_FLOAT,0);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_1e4);
  type_ = mapDataTypeToGenericVecType(local_18);
  sglr::pdec::FragmentOutput::FragmentOutput(&local_1e8,type_);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"u_coordMat",&local_231);
  sglr::pdec::Uniform::Uniform(&local_210,&local_230,TYPE_FLOAT_MAT3);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"u_sampler0",&local_281);
  sglr::pdec::Uniform::Uniform(&local_260,&local_280,glslVersion_local);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"u_scale",&local_2d1);
  sglr::pdec::Uniform::Uniform(&local_2b0,&local_2d0,TYPE_FLOAT_VEC4);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"u_bias",&local_321);
  sglr::pdec::Uniform::Uniform(&local_300,&local_320,TYPE_FLOAT_VEC4);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_300);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"u_layer",&local_371);
  sglr::pdec::Uniform::Uniform(&local_350,&local_370,TYPE_INT);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_350);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"",&local_3f9);
  pcVar3 = "#version 320 es\n";
  if (local_1c == GLSL_VERSION_310_ES) {
    pcVar3 = "#version 310 es\n#extension GL_EXT_texture_cube_map_array : require\n";
  }
  std::operator+(&local_3d8,&local_3f8,pcVar3);
  std::operator+(&local_3b8,&local_3d8,
                 "in highp vec4 a_position;\nin mediump vec2 a_coord;\nuniform mat3 u_coordMat;\nout highp vec3 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = u_coordMat * vec3(a_coord, 1.0);\n}\n"
                );
  sglr::pdec::VertexSource::VertexSource(&local_398,&local_3b8);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_398);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"",&local_541);
  pcVar3 = "#version 320 es\n";
  if (local_1c == GLSL_VERSION_310_ES) {
    pcVar3 = "#version 310 es\n#extension GL_EXT_texture_cube_map_array : require\n";
  }
  std::operator+(&local_520,&local_540,pcVar3);
  std::operator+(&local_500,&local_520,"uniform highp ");
  pcVar3 = glu::getDataTypeName(glslVersion_local);
  std::operator+(&local_4e0,&local_500,pcVar3);
  std::operator+(&local_4c0,&local_4e0,
                 " u_sampler0;\nuniform highp vec4 u_scale;\nuniform highp vec4 u_bias;\nuniform highp int u_layer;\nin highp vec3 v_coord;\nlayout(location = 0) out highp "
                );
  pcVar3 = glu::getDataTypeName(local_18);
  std::operator+(&local_4a0,&local_4c0,pcVar3);
  std::operator+(&local_480,&local_4a0," o_color;\nvoid main (void)\n{\n\to_color = ");
  pcVar3 = glu::getDataTypeName(local_18);
  std::operator+(&local_460,&local_480,pcVar3);
  std::operator+(&local_440,&local_460,
                 "(vec4(texture(u_sampler0, vec4(v_coord, u_layer))) * u_scale + u_bias);\n}\n");
  sglr::pdec::FragmentSource::FragmentSource(&local_420,&local_440);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_420);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar2);
  sglr::pdec::FragmentSource::~FragmentSource(&local_420);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_520);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  sglr::pdec::VertexSource::~VertexSource(&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  sglr::pdec::Uniform::~Uniform(&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  sglr::pdec::Uniform::~Uniform(&local_300);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  sglr::pdec::Uniform::~Uniform(&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  sglr::pdec::Uniform::~Uniform(&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  sglr::pdec::Uniform::~Uniform(&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_130);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_032b44b0;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_032b44e8;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_032b4500;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&(this->super_ShaderProgram).field_0x154,1.0);
  tcu::Vector<float,_4>::Vector(&this->m_texBias,0.0);
  this->m_layer = 0;
  tcu::Matrix<float,_3,_3>::Matrix(&this->m_coordMat);
  this->m_outputType = local_18;
  while( true ) {
    dVar1 = ::deGetFalse();
    if ((dVar1 != 0) || ((local_1c != GLSL_VERSION_310_ES && (local_1c != GLSL_VERSION_320_ES))))
    break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      return;
    }
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,(char *)0x0,
             "glslVersion == glu::GLSL_VERSION_310_ES || glslVersion == glu::GLSL_VERSION_320_ES",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboTestUtil.cpp"
             ,0x138);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

TextureCubeArrayShader::TextureCubeArrayShader (glu::DataType samplerType, glu::DataType outputType, glu::GLSLVersion glslVersion)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(mapDataTypeToGenericVecType(outputType))
							<< sglr::pdec::Uniform("u_coordMat", glu::TYPE_FLOAT_MAT3)
							<< sglr::pdec::Uniform("u_sampler0", samplerType)
							<< sglr::pdec::Uniform("u_scale", glu::TYPE_FLOAT_VEC4)
							<< sglr::pdec::Uniform("u_bias", glu::TYPE_FLOAT_VEC4)
							<< sglr::pdec::Uniform("u_layer", glu::TYPE_INT)
							<< sglr::pdec::VertexSource(
									string("") +
									((glslVersion == glu::GLSL_VERSION_310_ES) ?
									"#version 310 es\n"
									"#extension GL_EXT_texture_cube_map_array : require\n"
									 : "#version 320 es\n") +
									"in highp vec4 a_position;\n"
									"in mediump vec2 a_coord;\n"
									"uniform mat3 u_coordMat;\n"
									"out highp vec3 v_coord;\n"
									"void main (void)\n"
									"{\n"
									"	gl_Position = a_position;\n"
									"	v_coord = u_coordMat * vec3(a_coord, 1.0);\n"
									"}\n")
							<< sglr::pdec::FragmentSource(
									string("") +
									((glslVersion == glu::GLSL_VERSION_310_ES) ?
									"#version 310 es\n"
									"#extension GL_EXT_texture_cube_map_array : require\n"
									 : "#version 320 es\n") +
									"uniform highp " + glu::getDataTypeName(samplerType) + " u_sampler0;\n"
									"uniform highp vec4 u_scale;\n"
									"uniform highp vec4 u_bias;\n"
									"uniform highp int u_layer;\n"
									"in highp vec3 v_coord;\n"
									"layout(location = 0) out highp " + glu::getDataTypeName(outputType) + " o_color;\n"
									"void main (void)\n"
									"{\n"
									"	o_color = " + glu::getDataTypeName(outputType) + "(vec4(texture(u_sampler0, vec4(v_coord, u_layer))) * u_scale + u_bias);\n"
									"}\n"))
	, m_texScale	(1.0f)
	, m_texBias		(0.0f)
	, m_layer		(0)
	, m_outputType	(outputType)
{
	TCU_CHECK_INTERNAL(glslVersion == glu::GLSL_VERSION_310_ES || glslVersion == glu::GLSL_VERSION_320_ES);
}